

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_D3D_DEF(Context *ctx)

{
  int in_ECX;
  size_t in_RDX;
  char val3 [32];
  char val2 [32];
  char val1 [32];
  char val0 [32];
  char dst [64];
  char local_f8 [32];
  char local_d8 [32];
  char local_b8 [32];
  char local_98 [32];
  char local_78 [72];
  
  make_D3D_destarg_string(ctx,local_78,in_RDX);
  floatstr(ctx,local_98,0,(float)ctx->dwords[0],in_ECX);
  floatstr(ctx,local_b8,0,(float)ctx->dwords[1],in_ECX);
  floatstr(ctx,local_d8,0,(float)ctx->dwords[2],in_ECX);
  floatstr(ctx,local_f8,0,(float)ctx->dwords[3],in_ECX);
  output_line(ctx,"def%s, %s, %s, %s, %s",local_78,local_98,local_b8,local_d8,local_f8);
  return;
}

Assistant:

static void emit_D3D_DEF(Context *ctx)
{
    char dst[64];
    make_D3D_destarg_string(ctx, dst, sizeof (dst));
    const float *val = (const float *) ctx->dwords; // !!! FIXME: could be int?
    char val0[32];
    char val1[32];
    char val2[32];
    char val3[32];
    floatstr(ctx, val0, sizeof (val0), val[0], 0);
    floatstr(ctx, val1, sizeof (val1), val[1], 0);
    floatstr(ctx, val2, sizeof (val2), val[2], 0);
    floatstr(ctx, val3, sizeof (val3), val[3], 0);
    output_line(ctx, "def%s, %s, %s, %s, %s", dst, val0, val1, val2, val3);
}